

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void n_string_suite::n_string_backslash_00(void)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  undefined1 local_168 [8];
  reader reader;
  string_view view;
  char input [5];
  
  view._M_str._4_1_ = 0;
  view._M_str._0_4_ = 0x5d005c5b;
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         &reader.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,(char *)&view._M_str,5);
  trial::protocol::json::basic_reader<char>::basic_reader((basic_reader<char> *)local_168,this);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_168);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x76c,"void n_string_suite::n_string_backslash_00()",local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_168);
  local_18c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_168);
  local_190 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x76e,"void n_string_suite::n_string_backslash_00()",local_18c,&local_190);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_168);
  return;
}

Assistant:

void n_string_backslash_00()
{
    const char input[] = "[\\\x00]";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}